

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::~QAction(QAction *this)

{
  bool bVar1;
  QActionPrivate *pQVar2;
  QCoreApplication *pQVar3;
  const_iterator o;
  int *piVar4;
  QGuiApplicationPrivate *pQVar5;
  QObject *in_RDI;
  long in_FS_OFFSET;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  QAction *in_stack_00000008;
  int id;
  add_const_t<QList<int>_> *__range2;
  QActionPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  QList<int> *in_stack_ffffffffffffffa0;
  QShortcutMap *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  QList<int> *this_01;
  const_iterator local_10;
  QObject *owner;
  
  owner = *(QObject **)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_00e22288;
  pQVar2 = d_func((QAction *)0x975b78);
  (**(code **)(*(long *)pQVar2 + 0x20))();
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QActionGroup> *)0x975b96);
  if (bVar1) {
    QPointer<QActionGroup>::operator->((QPointer<QActionGroup> *)0x975baa);
    QActionGroup::removeAction
              ((QActionGroup *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_00000008);
  }
  pQVar3 = QCoreApplication::instance();
  if (pQVar3 != (QCoreApplication *)0x0) {
    this_01 = &pQVar2->shortcutIds;
    local_10.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<int>::begin(in_stack_ffffffffffffffa0);
    o = QList<int>::end(in_stack_ffffffffffffffa0);
    while (bVar1 = QList<int>::const_iterator::operator!=(&local_10,o), bVar1) {
      piVar4 = QList<int>::const_iterator::operator*(&local_10);
      iVar6 = *piVar4;
      if (iVar6 != 0) {
        pQVar5 = QGuiApplicationPrivate::instance();
        this_00 = &pQVar5->shortcutMap;
        QKeySequence::QKeySequence((QKeySequence *)0x975c73);
        QShortcutMap::removeShortcut
                  ((QShortcutMap *)this_01,unaff_retaddr_00,owner,
                   (QKeySequence *)CONCAT44(iVar6,in_stack_ffffffffffffffb8));
        QKeySequence::~QKeySequence((QKeySequence *)this_00);
      }
      QList<int>::const_iterator::operator++(&local_10);
    }
  }
  QObject::~QObject(in_RDI);
  if (*(QObject **)(in_FS_OFFSET + 0x28) != owner) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QAction::~QAction()
{
    Q_D(QAction);

    d->destroy();

    if (d->group)
        d->group->removeAction(this);
#if QT_CONFIG(shortcut)
    if (qApp) {
        for (int id : std::as_const(d->shortcutIds)) {
            if (id)
                QGuiApplicationPrivate::instance()->shortcutMap.removeShortcut(id, this);
        }
    }
#endif
}